

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_address.h
# Opt level: O0

void __thiscall
sockpp::sock_address_any::sock_address_any
          (sock_address_any *this,sockaddr_storage *addr,socklen_t n)

{
  length_error *this_00;
  socklen_t n_local;
  sockaddr_storage *addr_local;
  sock_address_any *this_local;
  
  sock_address::sock_address(&this->super_sock_address);
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__sock_address_any_00119be0;
  (this->addr_).ss_family = 0;
  memset((this->addr_).__ss_padding,0,0x76);
  (this->addr_).__ss_align = 0;
  this->sz_ = 0x80;
  if (0x80 < n) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"Address length out of range");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  this->sz_ = n;
  memcpy(&this->addr_,addr,(ulong)n);
  return;
}

Assistant:

sock_address_any(const sockaddr_storage& addr, socklen_t n) {
        if (size_t(n) > MAX_SZ)
            throw std::length_error("Address length out of range");
        std::memcpy(&addr_, &addr, sz_ = n);
    }